

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall
Clasp::DynamicLimit::resetAdjust(DynamicLimit *this,float k,Type t,uint32 uLimit,bool resetAvg)

{
  byte in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  
  memset(in_RDI,0,0x14);
  *in_RDI = in_EDX;
  in_RDI[3] = in_XMM0_Da;
  in_RDI[4] = in_ESI;
  if ((in_CL & 1) != 0) {
    in_RDI[0x18] = 0;
    MovingAvg::clear((MovingAvg *)(in_RDI + 0x12));
  }
  return;
}

Assistant:

void DynamicLimit::resetAdjust(float k, Type t, uint32 uLimit, bool resetAvg) {
	std::memset(&adjust, 0, sizeof(adjust));
	adjust.limit = uLimit;
	adjust.rk = k;
	adjust.type = t;
	if (resetAvg) {
		num_ = 0;
		avg_.clear();
	}
}